

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O0

void Min_CoverWriteStore(FILE *pFile,Min_Man_t *p)

{
  uint local_24;
  Min_Cube_t *pMStack_20;
  int i;
  Min_Cube_t *pCube;
  Min_Man_t *p_local;
  FILE *pFile_local;
  
  for (local_24 = 0; (int)local_24 <= p->nVars; local_24 = local_24 + 1) {
    for (pMStack_20 = p->ppStore[(int)local_24]; pMStack_20 != (Min_Cube_t *)0x0;
        pMStack_20 = pMStack_20->pNext) {
      printf("%2d : ",(ulong)local_24);
      if (pMStack_20 == p->pBubble) {
        printf("Bubble\n");
      }
      else {
        Min_CubeWrite(pFile,pMStack_20);
      }
    }
  }
  printf("\n");
  return;
}

Assistant:

void Min_CoverWriteStore( FILE * pFile, Min_Man_t * p )
{
    Min_Cube_t * pCube;
    int i;
    for ( i = 0; i <= p->nVars; i++ )
    {
        Min_CoverForEachCube( p->ppStore[i], pCube )
        {
            printf( "%2d : ", i );
            if ( pCube == p->pBubble )
            {
                printf( "Bubble\n" );
                continue;
            }
            Min_CubeWrite( pFile, pCube );
        }
    }
    printf( "\n" );
}